

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::AddTxOut(Psbt *this,Script *locking_script,Amount *amount)

{
  wally_psbt *psbt;
  uint32_t uVar1;
  uint64_t satoshi;
  uchar *script_00;
  size_type script_len;
  CfdException *pCVar2;
  Transaction local_140;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8;
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  CfdSourceLocation local_98;
  int local_7c;
  wally_tx_output *pwStack_78;
  int ret;
  wally_tx_output *output;
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  uint32_t index;
  wally_psbt *psbt_pointer;
  Amount *amount_local;
  Script *locking_script_local;
  Psbt *this_local;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint32_t)psbt->num_outputs;
  Script::GetData(&local_60,locking_script);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,&local_60);
  ByteData::~ByteData(&local_60);
  pwStack_78 = (wally_tx_output *)0x0;
  satoshi = Amount::GetSatoshiValue(amount);
  script_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_7c = wally_tx_output_init_alloc(satoshi,script_00,script_len,&stack0xffffffffffffff88);
  if (local_7c != 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xb52;
    local_98.funcname = "AddTxOut";
    logger::warn<int&>(&local_98,"wally_tx_output_init_alloc NG[{}]",&local_7c);
    local_ba = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b8,"psbt alloc output error.",&local_b9);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_b8);
    local_ba = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_7c = wally_psbt_add_output_at
                       (psbt,script.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,pwStack_78);
  wally_tx_output_free(pwStack_78);
  if (local_7c != 0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0xb59;
    local_d8.funcname = "AddTxOut";
    logger::warn<int&>(&local_d8,"wally_psbt_add_output_at NG[{}]",&local_7c);
    local_fa = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f8,"psbt add output error.",&local_f9);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_f8);
    local_fa = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  RebuildTransaction(&local_140,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_140);
  Transaction::~Transaction(&local_140);
  uVar1 = script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxOut(const Script &locking_script, const Amount &amount) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t index = static_cast<uint32_t>(psbt_pointer->num_outputs);
  auto script = locking_script.GetData().GetBytes();
  struct wally_tx_output *output = nullptr;

  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(amount.GetSatoshiValue()), script.data(),
      script.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret = wally_psbt_add_output_at(psbt_pointer, index, 0, output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_add_output_at NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add output error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  return index;
}